

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void ra_append_move_range
               (roaring_array_t *ra,roaring_array_t *sa,int32_t start_index,int32_t end_index)

{
  int iVar1;
  int local_24;
  int32_t pos;
  int32_t i;
  int32_t end_index_local;
  int32_t start_index_local;
  roaring_array_t *sa_local;
  roaring_array_t *ra_local;
  
  extend_array(ra,end_index - start_index);
  for (local_24 = start_index; local_24 < end_index; local_24 = local_24 + 1) {
    iVar1 = ra->size;
    ra->keys[iVar1] = sa->keys[local_24];
    ra->containers[iVar1] = sa->containers[local_24];
    ra->typecodes[iVar1] = sa->typecodes[local_24];
    ra->size = ra->size + 1;
  }
  return;
}

Assistant:

void ra_append_move_range(roaring_array_t *ra, roaring_array_t *sa,
                          int32_t start_index, int32_t end_index) {
    extend_array(ra, end_index - start_index);

    for (int32_t i = start_index; i < end_index; ++i) {
        const int32_t pos = ra->size;

        ra->keys[pos] = sa->keys[i];
        ra->containers[pos] = sa->containers[i];
        ra->typecodes[pos] = sa->typecodes[i];
        ra->size++;
    }
}